

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O1

Variable * __thiscall soul::ModuleCloner::getRemappedVariable(ModuleCloner *this,Variable *old)

{
  mapped_type *pmVar1;
  Variable *pVVar2;
  key_type local_18;
  
  local_18.object = old;
  pmVar1 = std::__detail::
           _Map_base<soul::pool_ref<const_soul::heart::Variable>,_std::pair<const_soul::pool_ref<const_soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::Variable>_>,_std::hash<soul::pool_ref<const_soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<soul::pool_ref<const_soul::heart::Variable>,_std::pair<const_soul::pool_ref<const_soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::Variable>_>,_std::hash<soul::pool_ref<const_soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this->variableMappings,&local_18);
  pVVar2 = pmVar1->object;
  if (pVVar2 == (Variable *)0x0) {
    pVVar2 = cloneVariable(this,old);
  }
  return pVVar2;
}

Assistant:

heart::Variable& getRemappedVariable (heart::Variable& old)
    {
        auto v = variableMappings[old];
        return v == nullptr ? cloneVariable (old) : *v;
    }